

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseBuilder::_newAlignNode
          (BaseBuilder *this,AlignNode **out,uint32_t alignMode,uint32_t alignment)

{
  Error EVar1;
  uint32_t local_8;
  uint32_t uStack_4;
  
  _local_8 = CONCAT44(alignMode,alignment);
  *out = (AlignNode *)0x0;
  EVar1 = _newNodeT<asmjit::AlignNode,unsigned_int&,unsigned_int&>(this,out,&uStack_4,&local_8);
  return EVar1;
}

Assistant:

Error BaseBuilder::_newAlignNode(AlignNode** out, uint32_t alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}